

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::WasmByteCodeWriter::TryWriteAsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,RegSlot R1,RegSlot R2,RegSlot R3,
          RegSlot R4,RegSlot R5,RegSlot R6,RegSlot R7,RegSlot R8,RegSlot R9,RegSlot R10,RegSlot R11,
          RegSlot R12,RegSlot R13,RegSlot R14,RegSlot R15,RegSlot R16)

{
  bool bVar1;
  undefined1 local_19;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  undefined1 local_14;
  undefined1 local_13;
  undefined1 local_12;
  OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((((((DAT_015b5fbd == '\0') && (DAT_015b5fbc == '\0')) &&
         (local_19 = (undefined1)R0, R0 < 0x100)) &&
        ((local_18 = (undefined1)R1, R1 < 0x100 && (local_17 = (undefined1)R2, R2 < 0x100)))) &&
       ((local_16 = (undefined1)R3, R3 < 0x100 &&
        ((local_15 = (undefined1)R4, R4 < 0x100 && (local_14 = (undefined1)R5, R5 < 0x100)))))) &&
      (local_13 = (undefined1)R6, R6 < 0x100)) &&
     (((((local_12 = (undefined1)R7, R7 < 0x100 && (layout.R0 = (RegSlotType)R8, R8 < 0x100)) &&
        (layout.R1 = (RegSlotType)R9, R9 < 0x100)) &&
       (((layout.R2 = (RegSlotType)R10, R10 < 0x100 && (layout.R3 = (RegSlotType)R11, R11 < 0x100))
        && ((layout.R4 = (RegSlotType)R12, R12 < 0x100 &&
            ((layout.R5 = (RegSlotType)R13, R13 < 0x100 &&
             (layout.R6 = (RegSlotType)R14, R14 < 0x100)))))))) &&
      ((layout.R7 = (RegSlotType)R15, R15 < 0x100 && (layout.R8 = (RegSlotType)R16, R16 < 0x100)))))
     ) {
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_19,0x11,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteAsmReg17(OpCodeAsmJs op, RegSlot R0, RegSlot R1, RegSlot R2, RegSlot R3, RegSlot R4, RegSlot R5, RegSlot R6, RegSlot R7, RegSlot R8,
                                                               RegSlot R9, RegSlot R10, RegSlot R11, RegSlot R12, RegSlot R13, RegSlot R14, RegSlot R15, RegSlot R16)
    {
        OpLayoutT_AsmReg17<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R0, R0)   && SizePolicy::Assign(layout.R1, R1)   && SizePolicy::Assign(layout.R2, R2)   && SizePolicy::Assign(layout.R3, R3)   && SizePolicy::Assign(layout.R4, R4)   &&
            SizePolicy::Assign(layout.R5, R5)   && SizePolicy::Assign(layout.R6, R6)   && SizePolicy::Assign(layout.R7, R7)   && SizePolicy::Assign(layout.R8, R8)   && SizePolicy::Assign(layout.R9, R9)   &&
            SizePolicy::Assign(layout.R10, R10) && SizePolicy::Assign(layout.R11, R11) && SizePolicy::Assign(layout.R12, R12) && SizePolicy::Assign(layout.R13, R13) && SizePolicy::Assign(layout.R14, R14) &&
            SizePolicy::Assign(layout.R15, R15) && SizePolicy::Assign(layout.R16, R16))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }